

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

Error asmjit::Formatter::formatFuncValuePack
                (String *sb,uint32_t formatFlags,BaseEmitter *emitter,FuncValuePack *pack,
                VirtReg **vRegs)

{
  byte bVar1;
  VirtReg *pVVar2;
  int iVar3;
  Error EVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  uint32_t uVar8;
  
  uVar6 = 5;
  do {
    if (uVar6 == 1) {
      EVar4 = String::_opString(sb,1,"void",0xffffffffffffffff);
      return EVar4;
    }
    iVar3 = (int)uVar6;
    uVar6 = uVar6 - 1;
  } while (pack->_values[iVar3 - 2]._data == 0);
  if (uVar6 != 1) {
    String::_opChar(sb,1,'[');
  }
  uVar7 = 0;
  do {
    uVar8 = pack->_values[uVar7]._data;
    if (uVar8 == 0) break;
    if (uVar7 != 0) {
      EVar4 = String::_opString(sb,1,", ",0xffffffffffffffff);
      if (EVar4 != 0) {
        return EVar4;
      }
      uVar8 = pack->_values[uVar7]._data;
    }
    EVar4 = formatTypeId(sb,uVar8 & 0xff);
    if (EVar4 != 0) {
      return EVar4;
    }
    if ((uVar8 & 0x300) != 0) {
      EVar4 = String::_opChar(sb,1,'@');
      if (EVar4 != 0) {
        return EVar4;
      }
      if (((uVar8 >> 10 & 1) != 0) && (EVar4 = String::_opChar(sb,1,'['), EVar4 != 0)) {
        return EVar4;
      }
      if ((uVar8 >> 8 & 1) != 0) {
        bVar1 = (emitter->_environment)._arch;
        if (1 < bVar1 - 1) {
          return 4;
        }
        EVar4 = x86::FormatterInternal::formatRegister
                          (sb,formatFlags,emitter,(uint)bVar1,uVar8 >> 0x18,uVar8 >> 0x10 & 0xff);
        if (EVar4 != 0) {
          return EVar4;
        }
      }
      if (((uVar8 >> 9 & 1) != 0) &&
         (EVar4 = String::_opFormat(sb,1,"[%d]",(ulong)(uint)((int)uVar8 >> 0xc)), EVar4 != 0)) {
        return EVar4;
      }
      if (((uVar8 >> 10 & 1) != 0) && (EVar4 = String::_opChar(sb,1,']'), EVar4 != 0)) {
        return EVar4;
      }
    }
    if (vRegs != (VirtReg **)0x0) {
      pVVar2 = vRegs[uVar7];
      pcVar5 = "<none>";
      if (pVVar2 != (VirtReg *)0x0) {
        if (*(uint *)&(pVVar2->_name).field_0 < 0xc) {
          pcVar5 = (char *)((long)&(pVVar2->_name).field_0 + 4);
        }
        else {
          pcVar5 = *(char **)((long)&(pVVar2->_name).field_0 + 8);
        }
      }
      EVar4 = String::_opFormat(sb,1," %s",pcVar5);
      if (EVar4 != 0) {
        return EVar4;
      }
    }
    uVar7 = uVar7 + 1;
  } while (uVar7 < uVar6);
  if (uVar6 != 1) {
    String::_opChar(sb,1,']');
  }
  return 0;
}

Assistant:

static Error formatFuncValuePack(
  String& sb,
  uint32_t formatFlags,
  const BaseEmitter* emitter,
  const FuncValuePack& pack,
  VirtReg* const* vRegs) noexcept {

  size_t count = pack.count();
  if (!count)
    return sb.append("void");

  if (count > 1)
    sb.append('[');

  for (uint32_t valueIndex = 0; valueIndex < count; valueIndex++) {
    const FuncValue& value = pack[valueIndex];
    if (!value)
      break;

    if (valueIndex)
      ASMJIT_PROPAGATE(sb.append(", "));

    ASMJIT_PROPAGATE(formatFuncValue(sb, formatFlags, emitter, value));

    if (vRegs) {
      static const char nullRet[] = "<none>";
      ASMJIT_PROPAGATE(sb.appendFormat(" %s", vRegs[valueIndex] ? vRegs[valueIndex]->name() : nullRet));
    }
  }

  if (count > 1)
    sb.append(']');

  return kErrorOk;
}